

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

number_validator<unsigned_long> __thiscall goodform::sub_form::uint64(sub_form *this)

{
  bool bVar1;
  unsigned_long extraout_RDX;
  unsigned_long extraout_RDX_00;
  unsigned_long uVar2;
  undefined8 *in_RSI;
  number_validator<unsigned_long> nVar3;
  uint64_t val;
  allocator<char> local_61;
  any *local_60;
  string local_58;
  error_message local_38;
  
  bVar1 = convert<unsigned_long>((any *)in_RSI[1],(unsigned_long *)&local_60);
  uVar2 = extraout_RDX;
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"NOT A uint64_t",&local_61);
    error_message::error_message(&local_38,&local_58);
    std::__cxx11::string::operator=((string *)*in_RSI,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    uVar2 = extraout_RDX_00;
  }
  this->error_ = (error_message *)*in_RSI;
  this->variant_ = local_60;
  nVar3.value_ = uVar2;
  nVar3.error_ = (error_message *)this;
  return nVar3;
}

Assistant:

number_validator<std::uint64_t> sub_form::uint64()
  {
    std::uint64_t val;
    if (!convert(this->variant_, val))
      this->error_ = error_message("NOT A uint64_t");
    return number_validator<std::uint64_t>(val, this->error_);
  }